

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeventqueue.cpp
# Opt level: O2

void __thiscall
QXcbEventQueue::waitForNewEvents
          (QXcbEventQueue *this,QXcbEventNode *sinceFlushedTail,unsigned_long time)

{
  QXcbEventQueue *this_00;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this + 0x78;
  local_38.m_isLocked = true;
  local_38._9_7_ = 0xaaaaaaaaaaaaaa;
  local_38.m_mutex = (QMutex *)this_00;
  QBasicMutex::lock((QBasicMutex *)this_00);
  local_38.m_isLocked = true;
  *(QXcbEventNode **)(this + 0x18) = *(QXcbEventNode **)(this + 0x20);
  if (*(QXcbEventNode **)(this + 0x20) == sinceFlushedTail) {
    QWaitCondition::wait((QMutex *)(this + 0x80),(ulong)this_00);
  }
  QMutexLocker<QMutex>::~QMutexLocker(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXcbEventQueue::waitForNewEvents(const QXcbEventNode *sinceFlushedTail,
                                      unsigned long time)
{
    QMutexLocker locker(&m_newEventsMutex);
    flushBufferedEvents();
    if (sinceFlushedTail != m_flushedTail)
        return;
    m_newEventsCondition.wait(&m_newEventsMutex, time);
}